

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SetRepeatedEnum
          (ExtensionSet *this,int number,int index,int value)

{
  Extension *pEVar1;
  LogMessage *pLVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,0x1e6);
    pLVar2 = LogMessage::operator<<(&local_58,"CHECK failed: extension != NULL: ");
    pLVar2 = LogMessage::operator<<(pLVar2,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_59,pLVar2);
    LogMessage::~LogMessage(&local_58);
  }
  *(int *)((long)((pEVar1->field_0).repeated_int32_value)->arena_or_elements_ + (long)index * 4) =
       value;
  return;
}

Assistant:

void ExtensionSet::SetRepeatedEnum(int number, int index, int value) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  extension->repeated_enum_value->Set(index, value);
}